

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O2

void * rzalloc_array_size(void *ctx,size_t size,uint count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = CONCAT44(0,count);
  if (SUB168(auVar1 * auVar2,8) != 0) {
    return (void *)0x0;
  }
  pvVar3 = rzalloc_size(ctx,CONCAT44(0,count) * size);
  return pvVar3;
}

Assistant:

void *
rzalloc_array_size(const void *ctx, size_t size, unsigned count)
{
   if (count > SIZE_MAX/size)
      return NULL;

   return rzalloc_size(ctx, size * count);
}